

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O2

void read_filler_data_rbsp(h264_stream_t *h,bs_t *b)

{
  uint32_t uVar1;
  bs_t *pbVar2;
  h264_stream_t *h_00;
  
  pbVar2 = b;
  while( true ) {
    h_00 = (h264_stream_t *)b;
    uVar1 = bs_next_bits(b,(int)pbVar2);
    if (uVar1 != 0xff) break;
    pbVar2 = (bs_t *)0x8;
    bs_read_u(b,8);
  }
  read_rbsp_trailing_bits(h_00,b);
  return;
}

Assistant:

void read_filler_data_rbsp(h264_stream_t* h, bs_t* b)
{
    while( bs_next_bits(b, 8) == 0xFF )
    {
        int ff_byte = bs_read_f(b,8);  // equal to 0xFF
    }
    read_rbsp_trailing_bits(h, b);
}